

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

Position * __thiscall
iDynTree::SpatialInertia::getCenterOfMass(Position *__return_storage_ptr__,SpatialInertia *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  
  Position::Position(__return_storage_ptr__);
  dVar1 = this->m_mass;
  if (dVar1 == 0.0) {
    (__return_storage_ptr__->super_Vector3).m_data[0] = 0.0;
    (__return_storage_ptr__->super_Vector3).m_data[1] = 0.0;
    (__return_storage_ptr__->super_Vector3).m_data[2] = 0.0;
  }
  else {
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar2 = divpd(*(undefined1 (*) [16])this->m_mcom,auVar2);
    *(undefined1 (*) [16])(__return_storage_ptr__->super_Vector3).m_data = auVar2;
    (__return_storage_ptr__->super_Vector3).m_data[2] = this->m_mcom[2] / dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Position SpatialInertia::getCenterOfMass() const
{
    Position ret;

    if( fabs(this->m_mass) > 0 )
    {
        ret(0) = this->m_mcom[0]/this->m_mass;
        ret(1) = this->m_mcom[1]/this->m_mass;
        ret(2) = this->m_mcom[2]/this->m_mass;
    }
    else
    {
        ret.zero();
    }

    return ret;
}